

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_layout_space_end(nk_context *ctx)

{
  nk_panel *pnVar1;
  nk_rect *__s;
  ulong uVar2;
  ulong uVar3;
  
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (pnVar1 = ctx->current->layout, pnVar1 != (nk_panel *)0x0)) {
    (pnVar1->row).item_width = 0.0;
    (pnVar1->row).item_height = 0.0;
    (pnVar1->row).item_offset = 0.0;
    __s = &(pnVar1->row).item;
    uVar2 = (ulong)__s & 3;
    if (uVar2 == 0) {
      uVar3 = 0x10;
    }
    else {
      memset(__s,0,4 - uVar2);
      uVar3 = uVar2 | 0xc;
      __s = (nk_rect *)((long)__s + (4 - uVar2));
    }
    uVar2 = (ulong)((uint)uVar3 & 0xfffffffc);
    memset(__s,0,uVar2);
    if ((uVar3 & 3) != 0) {
      memset((void *)((long)&__s->x + uVar2),0,uVar3 & 3);
      return;
    }
  }
  return;
}

Assistant:

NK_API void
nk_layout_space_end(struct nk_context *ctx)
{
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
layout->row.item_width = 0;
layout->row.item_height = 0;
layout->row.item_offset = 0;
nk_zero(&layout->row.item, sizeof(layout->row.item));
}